

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_SelectCoinsBnB_single_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_SelectCoinsBnB_single_with_asset_Test *this)

{
  uint32_t vout;
  pointer pTVar1;
  bool bVar2;
  byte bVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  pointer hex;
  void *pvVar6;
  char *pcVar7;
  CoinSelectionOption *in_R9;
  long lVar8;
  pointer utxo;
  undefined8 uVar9;
  Amount AVar10;
  AssertHelper local_1d8;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  AssertHelper local_1a0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelectionOption option_params;
  Amount local_110;
  Amount fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  AmountMap map_select_value;
  CoinSelection local_90;
  AmountMap map_target_amount;
  
  cfd::CoinSelection::CoinSelection(&local_90,true);
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_amount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&option_params,&exp_dummy_asset_a);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](&map_target_amount,(key_type *)&option_params);
  *pmVar4 = 0x93e0a40;
  if ((uint64_t *)option_params._0_8_ != &option_params.effective_fee_baserate_) {
    operator_delete((void *)option_params._0_8_,option_params.effective_fee_baserate_ + 1);
  }
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_select_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::Amount::Amount(&fee);
  AVar10 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_110.amount_ = AVar10.amount_;
  local_110.ignore_check_ = AVar10.ignore_check_;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (&utxos,((long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)kExtCoinSelectElementsTestVector.
                           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar1 = kExtCoinSelectElementsTestVector.
           super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kExtCoinSelectElementsTestVector.
      super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      kExtCoinSelectElementsTestVector.
      super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    hex = kExtCoinSelectElementsTestVector.
          super__Vector_base<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    utxo = utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)&option_params);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)&gtest_ar,&hex->txid);
        cfd::core::Txid::operator=((Txid *)&option_params,(Txid *)&gtest_ar);
        gtest_ar._0_8_ = &PTR__Txid_0086d9f8;
        pvVar6 = (void *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,local_1b0._8_8_ - (long)pvVar6);
        }
      }
      vout = hex->vout;
      AVar10 = cfd::core::Amount::CreateBySatoshiAmount(hex->amount);
      gtest_ar._0_8_ = AVar10.amount_;
      gtest_ar.message_.ptr_._0_1_ = AVar10.ignore_check_;
      in_R9 = (CoinSelectionOption *)0x0;
      cfd::CoinSelection::ConvertToUtxo
                ((Txid *)&option_params,vout,&hex->descriptor,(Amount *)&gtest_ar,&hex->asset,
                 (void *)0x0,utxo,(Script *)0x0);
      option_params._0_8_ = &PTR__Txid_0086d9f8;
      if (option_params._8_8_ != 0) {
        operator_delete((void *)option_params._8_8_,
                        option_params.long_term_fee_baserate_ - option_params._8_8_);
      }
      utxo = utxo + 1;
      hex = hex + 1;
    } while (hex != pTVar1);
  }
  cfd::CoinSelectionOption::CoinSelectionOption(&option_params);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option_params);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option_params,2.0);
  cfd::CoinSelectionOption::SetFeeAsset(&option_params,&exp_dummy_asset_a);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    lVar8 = 0;
    pvVar6 = (void *)0x0;
    uVar9 = (pointer)0x0;
    if (bVar2) {
      in_R9 = &option_params;
      cfd::CoinSelection::SelectCoins
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&gtest_ar,&local_90,
                 &map_target_amount,&utxos,&exp_filter,in_R9,&local_110,&map_select_value,&fee,
                 &map_searched_bnb,(AmountMap *)0x0);
      lVar8 = CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
      pvVar6 = (void *)gtest_ar._0_8_;
      uVar9 = local_1b0._M_allocated_capacity;
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x473,
               "Expected: (select_utxos = coin_select.SelectCoins(map_target_amount, utxos, exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
    pvVar6 = (void *)0x0;
    lVar8 = 0;
    uVar9 = (pointer)0x0;
  }
  gtest_ar_3._0_8_ = (lVar8 - (long)pvVar6 >> 3) * -0x7b425ed097b425ed;
  local_1d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"select_utxos.size()","1",(unsigned_long *)&gtest_ar_3,
             (int *)&local_1d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x474,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (gtest_ar_3._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (lVar8 - (long)pvVar6 == 0xd8) {
    gtest_ar_3._0_8_ = &DAT_093e10e4;
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)&gtest_ar,"select_utxos[0].amount","static_cast<int64_t>(155062500)",
               (unsigned_long *)((long)pvVar6 + 0x80),(long *)&gtest_ar_3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_3);
      if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
          (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x476,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      if (gtest_ar_3._0_8_ != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (gtest_ar_3._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_3._0_8_ = map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_select_value.size()","1",(unsigned_long *)&gtest_ar_3,
             (int *)&local_1d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x478,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (gtest_ar_3._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (map_select_value._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[](&map_select_value,(key_type *)&gtest_ar);
    local_1d8.data_._0_4_ = 0x93e10e4;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&gtest_ar_3,"map_select_value[exp_dummy_asset_a.GetHex()]","155062500",
               pmVar4,(int *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_1b0) {
      operator_delete((void *)gtest_ar._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
    }
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_3.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x47a,pcVar7);
      testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      if (gtest_ar._0_8_ != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (gtest_ar._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_3.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  gtest_ar_3._0_8_ = cfd::core::Amount::GetSatoshiValue(&fee);
  local_1d8.data_._0_4_ = 0xb8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"fee.GetSatoshiValue()","184",(long *)&gtest_ar_3,
             (int *)&local_1d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x47c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (gtest_ar_3._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_3._0_8_ = map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_1d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"map_searched_bnb.size()","1",(unsigned_long *)&gtest_ar_3,
             (int *)&local_1d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x47d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if (gtest_ar_3._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_3._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar,&exp_dummy_asset_a);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&map_searched_bnb,(key_type *)&gtest_ar);
    gtest_ar_3.success_ = *pmVar5;
    gtest_ar_3.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar3 = *pmVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_1b0) {
      operator_delete((void *)gtest_ar._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
      bVar3 = gtest_ar_3.success_;
    }
    if ((bVar3 & 1) == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_3,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 &in_R9->use_bnb_);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x47f,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_1b0) {
        operator_delete((void *)gtest_ar._0_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
      }
      if (CONCAT44(local_1d8.data_._4_4_,local_1d8.data_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT44(local_1d8.data_._4_4_,local_1d8.data_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_1d8.data_._4_4_,local_1d8.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_3.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,uVar9 - (long)pvVar6);
  }
  option_params.fee_asset_._vptr_ConfidentialAssetId =
       (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (option_params.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(option_params.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)option_params.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)option_params.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)utxos.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree(&map_searched_bnb._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_select_value._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&map_target_amount._M_t);
  if (local_90.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_90.randomize_cache_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_90.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_90.randomize_cache_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_SelectCoinsBnB_single_with_asset)
{
  CoinSelection coin_select(true);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 155060800;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset,
        nullptr, &(*ite));
    ++ite;
  }

  CoinSelectionOption option_params;
  option_params.InitializeConfidentialTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(2);
  option_params.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> select_utxos;
  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(map_target_amount, utxos,
      exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)));
  EXPECT_EQ(select_utxos.size(), 1);
  if (select_utxos.size() == 1) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(155062500));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 155062500);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 184);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}